

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ltm.c
# Opt level: O2

void luaT_adjustvarargs(lua_State *L,int nfixparams,CallInfo *ci,Proto *p)

{
  StkId pSVar1;
  StkId pSVar2;
  ulong uVar3;
  long lVar4;
  int iVar5;
  ulong uVar6;
  
  iVar5 = (int)((ulong)((long)(L->top).p - (ci->func).offset) >> 4);
  (ci->u).l.nextraargs = ~nfixparams + iVar5;
  pSVar2 = (L->top).p;
  lVar4 = (ulong)p->maxstacksize + 1;
  if ((long)(L->stack_last).p - (long)pSVar2 >> 4 <= lVar4) {
    luaD_growstack(L,(int)lVar4,1);
    pSVar2 = (L->top).p;
  }
  (L->top).p = pSVar2 + 1;
  pSVar1 = (ci->func).p;
  (pSVar2->val).value_ = (pSVar1->val).value_;
  (pSVar2->val).tt_ = *(lu_byte *)((long)pSVar1 + 8);
  uVar3 = 0;
  uVar6 = (ulong)(uint)nfixparams;
  if (nfixparams < 1) {
    uVar6 = uVar3;
  }
  for (; uVar6 * 0x10 != uVar3; uVar3 = uVar3 + 0x10) {
    pSVar2 = (L->top).p;
    (L->top).p = pSVar2 + 1;
    lVar4 = (ci->func).offset;
    (pSVar2->val).value_ = *(Value *)(lVar4 + 0x10 + uVar3);
    (pSVar2->val).tt_ = *(lu_byte *)(lVar4 + 0x18 + uVar3);
    *(undefined1 *)((ci->func).offset + 0x18 + uVar3) = 0;
  }
  (ci->func).p = (ci->func).p + iVar5;
  (ci->top).p = (ci->top).p + iVar5;
  return;
}

Assistant:

void luaT_adjustvarargs (lua_State *L, int nfixparams, CallInfo *ci,
                         const Proto *p) {
  int i;
  int actual = cast_int(L->top.p - ci->func.p) - 1;  /* number of arguments */
  int nextra = actual - nfixparams;  /* number of extra arguments */
  ci->u.l.nextraargs = nextra;
  luaD_checkstack(L, p->maxstacksize + 1);
  /* copy function to the top of the stack */
  setobjs2s(L, L->top.p++, ci->func.p);
  /* move fixed parameters to the top of the stack */
  for (i = 1; i <= nfixparams; i++) {
    setobjs2s(L, L->top.p++, ci->func.p + i);
    setnilvalue(s2v(ci->func.p + i));  /* erase original parameter (for GC) */
  }
  ci->func.p += actual + 1;
  ci->top.p += actual + 1;
  lua_assert(L->top.p <= ci->top.p && ci->top.p <= L->stack_last.p);
}